

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::App(App *this,string *app_description,string *app_name)

{
  string *in_RDX;
  string *in_RSI;
  App *in_stack_00000078;
  string *in_stack_00000080;
  string *in_stack_00000088;
  App *in_stack_00000090;
  allocator<char> local_b1;
  string local_b0 [16];
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  App *in_stack_ffffffffffffff80;
  string local_58 [32];
  string local_38 [56];
  
  ::std::__cxx11::string::string(local_38,in_RSI);
  ::std::__cxx11::string::string(local_58,in_RDX);
  App(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  ::std::__cxx11::string::~string(local_58);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  set_help_flag(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  ::std::__cxx11::string::~string(local_b0);
  ::std::allocator<char>::~allocator(&local_b1);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  return;
}

Assistant:

explicit App(std::string app_description = "", std::string app_name = "")
        : App(app_description, app_name, nullptr) {
        set_help_flag("-h,--help", "Print this help message and exit");
    }